

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZArc3D::ComputeR2Points
          (TPZArc3D *this,TPZFMatrix<double> *coord,double *xa,double *ya,double *xb,double *yb)

{
  TPZFNMatrix<9,_double> *this_00;
  double *pdVar1;
  long lVar2;
  TPZFMatrix<double> *pTVar3;
  TPZFMatrix<double> *coord_00;
  TPZArc3D *this_01;
  long col;
  double dVar4;
  TPZSavable local_a8;
  TPZManVector<double,_3> Temp;
  TPZManVector<double,_3> Axe;
  
  Temp.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&Axe,3,(double *)&Temp);
  local_a8._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&Temp,3,(double *)&local_a8);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = TPZFMatrix<double>::operator()(coord,lVar2,0);
    dVar4 = *pdVar1;
    pdVar1 = TPZFMatrix<double>::operator()(coord,lVar2,2);
    Axe.super_TPZVec<double>.fStore[lVar2] = dVar4 - *pdVar1;
  }
  this_00 = &this->fICnBase;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (col = 0; col != 3; col = col + 1) {
      pdVar1 = TPZFMatrix<double>::operator()(&this_00->super_TPZFMatrix<double>,lVar2,col);
      Temp.super_TPZVec<double>.fStore[lVar2] =
           *pdVar1 * Axe.super_TPZVec<double>.fStore[col] + Temp.super_TPZVec<double>.fStore[lVar2];
    }
  }
  this_01 = (TPZArc3D *)&Temp;
  *xa = *Temp.super_TPZVec<double>.fStore;
  *ya = Temp.super_TPZVec<double>.fStore[1];
  coord_00 = (TPZFMatrix<double> *)&local_a8;
  local_a8._vptr_TPZSavable = (_func_int **)0x0;
  TPZVec<double>::Fill((TPZVec<double> *)this_01,(double *)coord_00,0,-1);
  for (pTVar3 = (TPZFMatrix<double> *)0x0; pTVar3 != (TPZFMatrix<double> *)0x3;
      pTVar3 = (TPZFMatrix<double> *)
               ((long)&(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable + 1)) {
    pdVar1 = TPZFMatrix<double>::operator()(coord,(int64_t)pTVar3,1);
    dVar4 = *pdVar1;
    coord_00 = pTVar3;
    this_01 = (TPZArc3D *)coord;
    pdVar1 = TPZFMatrix<double>::operator()(coord,(int64_t)pTVar3,2);
    Axe.super_TPZVec<double>.fStore[(long)pTVar3] = dVar4 - *pdVar1;
  }
  for (pTVar3 = (TPZFMatrix<double> *)0x0; pTVar3 != (TPZFMatrix<double> *)0x3;
      pTVar3 = (TPZFMatrix<double> *)
               ((long)&(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable + 1)) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      coord_00 = pTVar3;
      this_01 = (TPZArc3D *)this_00;
      pdVar1 = TPZFMatrix<double>::operator()
                         (&this_00->super_TPZFMatrix<double>,(int64_t)pTVar3,lVar2);
      Temp.super_TPZVec<double>.fStore[(long)pTVar3] =
           *pdVar1 * Axe.super_TPZVec<double>.fStore[lVar2] +
           Temp.super_TPZVec<double>.fStore[(long)pTVar3];
    }
  }
  *xb = *Temp.super_TPZVec<double>.fStore;
  dVar4 = Temp.super_TPZVec<double>.fStore[1];
  *yb = dVar4;
  dVar4 = ArcAngle(this_01,coord_00,*xa,*ya,*xb,dVar4);
  this->fAngle = dVar4;
  TPZManVector<double,_3>::~TPZManVector(&Temp);
  TPZManVector<double,_3>::~TPZManVector(&Axe);
  return;
}

Assistant:

void TPZArc3D::ComputeR2Points(TPZFMatrix<REAL> &coord, double &xa, double &ya, double &xb, double &yb)
{
	/** vector (ini - middle) written in new R2 base */
	TPZManVector<REAL,3> Axe(3,0.), Temp(3,0.);
	int i, j;
	for(i = 0; i < 3; i++) Axe[i] = coord(i,0) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xa = Temp[0]; ya = Temp[1];
	Temp.Fill(0.);
	
	/** vector (final - middle) written in new R2 base */
	for(i = 0; i < 3; i++) Axe[i] = coord(i,1) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xb = Temp[0]; yb = Temp[1];
	
	fAngle = ArcAngle(coord,xa, ya, xb, yb);
}